

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

NodePtr HighsHashTree<int,_HighsImplications::VarBound>::copy_recurse(NodePtr node)

{
  long *plVar1;
  uint uVar2;
  long lVar3;
  long *plVar4;
  long *__dest;
  NodePtr NVar5;
  logic_error *this;
  long *plVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  ulong uVar10;
  
  switch((uint)node.ptrAndType & 7) {
  case 0:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unexpected node type in empty in hash tree");
    goto LAB_002aa07b;
  case 1:
    plVar6 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
    __dest = (long *)operator_new(0x28);
    lVar8 = plVar6[1];
    lVar7 = plVar6[2];
    lVar3 = plVar6[3];
    *__dest = *plVar6;
    __dest[1] = lVar8;
    __dest[2] = lVar7;
    __dest[3] = lVar3;
    __dest[4] = plVar6[4];
    plVar9 = __dest;
    do {
      plVar4 = (long *)operator_new(0x20);
      plVar1 = (long *)*plVar6;
      lVar8 = plVar1[1];
      lVar7 = plVar1[2];
      lVar3 = plVar1[3];
      *plVar4 = *plVar1;
      plVar4[1] = lVar8;
      plVar4[2] = lVar7;
      plVar4[3] = lVar3;
      *plVar9 = (long)plVar4;
      plVar6 = (long *)*plVar6;
      plVar9 = plVar4;
    } while (*plVar6 != 0);
    uVar10 = 1;
    break;
  case 2:
    __dest = (long *)operator_new(0xd8);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0xd8);
    uVar10 = 2;
    break;
  case 3:
    __dest = (long *)operator_new(0x2d8);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x2d8);
    uVar10 = 3;
    break;
  case 4:
    __dest = (long *)operator_new(0x4d8);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x4d8);
    uVar10 = 4;
    break;
  case 5:
    __dest = (long *)operator_new(0x6d8);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x6d8);
    uVar10 = 5;
    break;
  case 6:
    plVar6 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
    lVar8 = *plVar6;
    lVar7 = POPCOUNT(lVar8);
    uVar2 = (uint)lVar7;
    __dest = (long *)operator_new((ulong)(uVar2 * 8 + 0x47 & 0xffffffc0));
    *__dest = *plVar6;
    uVar10 = 6;
    if (lVar8 != 0) {
      lVar8 = 1;
      if (1 < uVar2) {
        lVar8 = lVar7;
      }
      lVar7 = 0;
      do {
        NVar5 = copy_recurse((NodePtr)plVar6[lVar7 + 1]);
        __dest[lVar7 + 1] = NVar5.ptrAndType;
        lVar7 = lVar7 + 1;
      } while (lVar8 != lVar7);
    }
    break;
  case 7:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unexpected type in hash tree");
LAB_002aa07b:
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (NodePtr)((ulong)__dest | uVar10);
}

Assistant:

static NodePtr copy_recurse(NodePtr node) {
    switch (node.getType()) {
      case kEmpty:
        throw std::logic_error("Unexpected node type in empty in hash tree");
      case kListLeaf: {
        ListLeaf* leaf = node.getListLeaf();

        ListLeaf* copyLeaf = new ListLeaf(*leaf);

        ListNode* iter = &leaf->first;
        ListNode* copyIter = &copyLeaf->first;
        do {
          copyIter->next = new ListNode(*iter->next);
          iter = iter->next;
          copyIter = copyIter->next;
        } while (iter->next != nullptr);

        return copyLeaf;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = node.getInnerLeafSizeClass1();
        return new InnerLeaf<1>(*leaf);
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = node.getInnerLeafSizeClass2();
        return new InnerLeaf<2>(*leaf);
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = node.getInnerLeafSizeClass3();
        return new InnerLeaf<3>(*leaf);
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = node.getInnerLeafSizeClass4();
        return new InnerLeaf<4>(*leaf);
      }
      case kBranchNode: {
        BranchNode* branch = node.getBranchNode();
        int size = branch->occupation.num_set();
        BranchNode* newBranch =
            (BranchNode*)::operator new(getBranchNodeSize(size));
        newBranch->occupation = branch->occupation;
        for (int i = 0; i < size; ++i)
          newBranch->child[i] = copy_recurse(branch->child[i]);

        return newBranch;
      }
      default:
        throw std::logic_error("Unexpected type in hash tree");
    }
  }